

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::dispose
          (ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *this)

{
  Result *pRVar1;
  RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *pRVar2;
  Result *pRVar3;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Result *)0x0) {
    pRVar2 = this->pos;
    pRVar3 = this->endPtr;
    this->ptr = (Result *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
    this->endPtr = (Result *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pRVar1,0x28,((long)pRVar2 - (long)pRVar1) / 0x28,
               ((long)pRVar3 - (long)pRVar1) / 0x28,
               ArrayDisposer::
               Dispose_<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }